

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Node.hpp
# Opt level: O3

void __thiscall
CAMFImporter_NodeElement_Color::CAMFImporter_NodeElement_Color
          (CAMFImporter_NodeElement_Color *this,CAMFImporter_NodeElement *pParent)

{
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *plVar1;
  long lVar2;
  
  (this->super_CAMFImporter_NodeElement).Type = ENET_Color;
  (this->super_CAMFImporter_NodeElement).ID._M_dataplus._M_p =
       (pointer)&(this->super_CAMFImporter_NodeElement).ID.field_2;
  lVar2 = 0;
  (this->super_CAMFImporter_NodeElement).ID._M_string_length = 0;
  (this->super_CAMFImporter_NodeElement).ID.field_2._M_local_buf[0] = '\0';
  (this->super_CAMFImporter_NodeElement).Parent = pParent;
  plVar1 = &(this->super_CAMFImporter_NodeElement).Child;
  (this->super_CAMFImporter_NodeElement).Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->super_CAMFImporter_NodeElement).Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->super_CAMFImporter_NodeElement).Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_Color_007fe920;
  this->Composed = false;
  do {
    *(char **)((long)&this->Color_Composed[0]._M_dataplus._M_p + lVar2) =
         this->Color_Composed[0].field_2._M_local_buf + lVar2;
    *(undefined8 *)((long)&this->Color_Composed[0]._M_string_length + lVar2) = 0;
    this->Color_Composed[0].field_2._M_local_buf[lVar2] = '\0';
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x80);
  (this->Color).r = 0.0;
  (this->Color).g = 0.0;
  (this->Color).b = 0.0;
  (this->Color).a = 0.0;
  (this->Profile)._M_dataplus._M_p = (pointer)&(this->Profile).field_2;
  (this->Profile)._M_string_length = 0;
  (this->Profile).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

CAMFImporter_NodeElement(const EType pType, CAMFImporter_NodeElement* pParent)
	: Type(pType)
    , ID()
    , Parent(pParent)
    , Child() {
        // empty
    }